

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_test.cpp
# Opt level: O0

void __thiscall Sinc_ZeroHandling_Test::~Sinc_ZeroHandling_Test(Sinc_ZeroHandling_Test *this)

{
  void *in_RDI;
  
  ~Sinc_ZeroHandling_Test((Sinc_ZeroHandling_Test *)0x518b38);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Sinc, ZeroHandling) {
    Float x = 0;
    Float prev = 1;
    for (int i = 0; i < 10000; ++i) {
        Float cur = Sinc(x);
        EXPECT_LE(cur, prev);
        x = NextFloatUp(x);
        prev = cur;
    }

    x = -0;
    prev = 1;
    for (int i = 0; i < 10000; ++i) {
        Float cur = Sinc(x);
        EXPECT_LE(cur, prev);
        x = NextFloatDown(x);
        prev = cur;
    }
}